

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O3

cmTarget * __thiscall
cmMakefile::AddCustomCommandToTarget
          (cmMakefile *this,string *target,cmCustomCommandType type,
          unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> *cc)

{
  cmCustomCommand *pcVar1;
  bool bVar2;
  PolicyStatus cmp0116;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *outputs;
  cmCustomCommandLines *commandLines;
  cmTarget *pcVar3;
  _Head_base<0UL,_cmCustomCommand_*,_false> local_a0;
  undefined8 *local_98;
  undefined8 local_90;
  code *local_88;
  undefined8 uStack_80;
  _Any_data local_78;
  code *local_68;
  undefined8 uStack_60;
  _Any_data local_58;
  code *local_48;
  code *local_40;
  _Head_base<0UL,_cmCustomCommand_*,_false> local_38;
  
  outputs = cmCustomCommand::GetByproducts_abi_cxx11_
                      ((cc->_M_t).
                       super___uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>
                       .super__Head_base<0UL,_cmCustomCommand_*,_false>._M_head_impl);
  commandLines = cmCustomCommand::GetCommandLines
                           ((cc->_M_t).
                            super___uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>
                            .super__Head_base<0UL,_cmCustomCommand_*,_false>._M_head_impl);
  pcVar3 = GetCustomCommandTarget(this,target,Reject,&this->Backtrace);
  if (pcVar3 != (cmTarget *)0x0) {
    bVar2 = ValidateCustomCommand(this,commandLines);
    if (bVar2) {
      CreateGeneratedOutputs(this,outputs);
      pcVar1 = (cc->_M_t).
               super___uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_>._M_t.
               super__Tuple_impl<0UL,_cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>.
               super__Head_base<0UL,_cmCustomCommand_*,_false>._M_head_impl;
      cmp0116 = cmStateSnapshot::GetPolicy(&this->StateSnapshot,CMP0116,false);
      cmCustomCommand::SetCMP0116Status(pcVar1,cmp0116);
      pcVar1 = (cc->_M_t).
               super___uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_>._M_t.
               super__Tuple_impl<0UL,_cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>.
               super__Head_base<0UL,_cmCustomCommand_*,_false>._M_head_impl;
      (cc->_M_t).super___uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_>._M_t.
      super__Tuple_impl<0UL,_cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>.
      super__Head_base<0UL,_cmCustomCommand_*,_false>._M_head_impl = (cmCustomCommand *)0x0;
      local_90 = 0;
      local_a0._M_head_impl = pcVar1;
      local_98 = (undefined8 *)operator_new(0x18);
      *local_98 = this;
      local_98[1] = pcVar3;
      *(cmCustomCommandType *)(local_98 + 2) = type;
      local_78._M_unused._M_object = (void *)0x0;
      local_78._8_8_ = 0;
      local_68 = (code *)0x0;
      uStack_60 = 0;
      local_40 = std::
                 _Function_handler<void_(cmLocalGenerator_&,_const_cmListFileBacktrace_&,_std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmMakefile.cxx:1111:5)>
                 ::_M_invoke;
      local_58._8_8_ = local_90;
      local_48 = std::
                 _Function_handler<void_(cmLocalGenerator_&,_const_cmListFileBacktrace_&,_std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmMakefile.cxx:1111:5)>
                 ::_M_manager;
      local_88 = (code *)0x0;
      uStack_80 = 0;
      local_a0._M_head_impl = (cmCustomCommand *)0x0;
      local_58._M_unused._M_object = local_98;
      local_38._M_head_impl = pcVar1;
      AddGeneratorAction(this,(GeneratorAction *)&local_78);
      std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::~unique_ptr
                ((unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> *)&local_38);
      if (local_48 != (code *)0x0) {
        (*local_48)(&local_58,&local_58,__destroy_functor);
      }
      if (local_68 != (code *)0x0) {
        (*local_68)(&local_78,&local_78,__destroy_functor);
      }
      if (local_88 != (code *)0x0) {
        (*local_88)(&local_98,&local_98,3);
      }
      std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::~unique_ptr
                ((unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> *)&local_a0);
    }
  }
  return pcVar3;
}

Assistant:

cmTarget* cmMakefile::AddCustomCommandToTarget(
  const std::string& target, cmCustomCommandType type,
  std::unique_ptr<cmCustomCommand> cc)
{
  const auto& byproducts = cc->GetByproducts();
  const auto& commandLines = cc->GetCommandLines();

  cmTarget* t = this->GetCustomCommandTarget(
    target, cmObjectLibraryCommands::Reject, this->Backtrace);

  // Validate custom commands.
  if (!t || !this->ValidateCustomCommand(commandLines)) {
    return t;
  }

  // Always create the byproduct sources and mark them generated.
  this->CreateGeneratedOutputs(byproducts);

  cc->SetCMP0116Status(this->GetPolicyStatus(cmPolicies::CMP0116));

  // Dispatch command creation to allow generator expressions in outputs.
  this->AddGeneratorAction(
    std::move(cc),
    [=](cmLocalGenerator& lg, const cmListFileBacktrace& lfbt,
        std::unique_ptr<cmCustomCommand> tcc) {
      BacktraceGuard guard(this->Backtrace, lfbt);
      tcc->SetBacktrace(lfbt);
      detail::AddCustomCommandToTarget(lg, cmCommandOrigin::Project, t, type,
                                       std::move(tcc));
    });

  return t;
}